

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  char *pcVar2;
  TimeInMillis local_68;
  String local_60;
  String local_50;
  string local_40;
  int local_1c;
  UnitTest *pUStack_18;
  int param_2_local;
  UnitTest *unit_test_local;
  StreamingListener *this_local;
  
  local_1c = param_2;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  bVar1 = UnitTest::Passed(unit_test);
  local_68 = UnitTest::elapsed_time(pUStack_18);
  StreamableToString<long_long>((internal *)&local_60,&local_68);
  pcVar2 = String::c_str(&local_60);
  String::Format(&local_50,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 pcVar2);
  String::operator_cast_to_string(&local_40,&local_50);
  Send(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  String::~String(&local_50);
  String::~String(&local_60);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }